

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollAdapterBase.cpp
# Opt level: O1

size_t __thiscall
cursespp::ScrollAdapterBase::GetVisibleItems
          (ScrollAdapterBase *this,ScrollableWindow *window,size_t desiredTopIndex,
          deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
          *target)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  EntryPtr entry;
  value_type local_58;
  size_t local_48;
  deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  *local_40;
  ScrollableWindow *local_38;
  
  sVar5 = this->height;
  local_40 = target;
  local_38 = window;
  iVar2 = (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[3])();
  bVar1 = 0 < (int)sVar5;
  local_48 = desiredTopIndex;
  if ((int)desiredTopIndex < iVar2 && bVar1) {
    lVar6 = (long)(int)desiredTopIndex;
    do {
      (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[4])(&local_58,this,local_38,lVar6);
      (*(local_58.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_IEntry[4])
                (local_58.
                 super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,this->width);
      uVar3 = (*(local_58.
                 super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_IEntry[2])();
      std::
      deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
      ::push_back(local_40,&local_58);
      if (local_58.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      sVar5 = (ulong)((uint)sVar5 & 0x7fffffff) - (ulong)uVar3;
      lVar6 = lVar6 + 1;
      bVar1 = 0 < (int)sVar5;
    } while ((lVar6 < iVar2) && (0 < (int)sVar5));
  }
  if (bVar1) {
    std::
    deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::clear(local_40);
    sVar5 = this->height;
    iVar2 = (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[3])(this);
    uVar3 = iVar2 - 1;
    iVar2 = (int)sVar5;
    do {
      if (((int)uVar3 < 0) || (iVar2 < 0)) break;
      (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[4])(&local_58,this,local_38,(ulong)uVar3);
      (*(local_58.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_IEntry[4])
                (local_58.
                 super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,this->width);
      iVar4 = (*(local_58.
                 super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_IEntry[2])();
      iVar7 = iVar2;
      if (iVar4 <= iVar2) {
        std::
        deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
        ::push_front(local_40,&local_58);
        uVar3 = uVar3 - 1;
        iVar7 = iVar2 - iVar4;
      }
      if (local_58.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.
                   super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      bVar1 = iVar4 <= iVar2;
      iVar2 = iVar7;
    } while (bVar1);
    local_48 = (size_t)(int)(uVar3 + 1);
  }
  return local_48;
}

Assistant:

size_t ScrollAdapterBase::GetVisibleItems(
    cursespp::ScrollableWindow* window,
    size_t desiredTopIndex,
    std::deque<EntryPtr>& target)
{
    size_t actualTopIndex = desiredTopIndex;

    /* ensure we have enough data to draw from the specified position
    to the end. if we don't try to back up a bit until we can fill
    the buffer */
    int totalHeight = (int) this->height;
    int entryCount = (int) this->GetEntryCount();

    /* we assume the general case -- we're some where in the middle of the
    list. we'll start from the specified first item and work our way down */
    for (int i = (int) desiredTopIndex; i < entryCount && totalHeight > 0; i++) {
        EntryPtr entry = this->GetEntry(window, i);
        entry->SetWidth(this->width);
        totalHeight -= entry->GetLineCount();
        target.push_back(entry);
    }

    /* however, if the list is short, we can actually draw more items above
    the specified one. let's work our way backwards! */
    if (totalHeight > 0) {
        target.clear();

        totalHeight = this->height;
        int i = GetEntryCount() - 1;
        while (i >= 0 && totalHeight >= 0) {
            EntryPtr entry = this->GetEntry(window, i);
            entry->SetWidth(this->width);

            int lines = entry->GetLineCount();
            if (lines > totalHeight) {
                break; /* this Entry won't fit. bail. */
            }

            totalHeight -= lines;
            target.push_front(entry);
            --i;
        }

        actualTopIndex = i + 1;
    }

    return actualTopIndex;
}